

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsPublicationPublishString(HelicsPublication pub,char *str,HelicsError *err)

{
  PublicationObject *pPVar1;
  long in_RSI;
  __sv_type _Var2;
  PublicationObject *pubObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  Publication *in_stack_ffffffffffffffd0;
  
  pPVar1 = anon_unknown.dwarf_5d1c2::verifyPublication
                     (in_stack_ffffffffffffffc8,(HelicsError *)in_stack_ffffffffffffffc0);
  if (pPVar1 != (PublicationObject *)0x0) {
    if (in_RSI == 0) {
      _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffffd0 = (Publication *)_Var2._M_len;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffd0,
                 (char *)in_stack_ffffffffffffffc8);
    }
    helics::Publication::publish<std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void helicsPublicationPublishString(HelicsPublication pub, const char* str, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->publish(AS_STRING_VIEW(str));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}